

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IsRowid(char *z)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = sqlite3StrICmp(z,"_ROWID_");
  uVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = sqlite3StrICmp(z,"ROWID");
    if (iVar1 != 0) {
      iVar1 = sqlite3StrICmp(z,"OID");
      uVar2 = (uint)(iVar1 == 0);
    }
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsRowid(const char *z){
  if( sqlite3StrICmp(z, "_ROWID_")==0 ) return 1;
  if( sqlite3StrICmp(z, "ROWID")==0 ) return 1;
  if( sqlite3StrICmp(z, "OID")==0 ) return 1;
  return 0;
}